

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resSim.c
# Opt level: O2

Res_Sim_t * Res_SimAlloc(int nWords)

{
  Res_Sim_t *pRVar1;
  Vec_Ptr_t *pVVar2;
  Vec_Vec_t *pVVar3;
  void **ppvVar4;
  void *pvVar5;
  long lVar6;
  int nWords_00;
  
  pRVar1 = (Res_Sim_t *)calloc(1,0x68);
  pRVar1->nWords = nWords;
  nWords_00 = nWords * 0x20;
  pRVar1->nPats = nWords_00;
  pRVar1->nWordsIn = nWords_00;
  pRVar1->nBytesIn = nWords << 7;
  pRVar1->nPatsIn = nWords << 10;
  pRVar1->nWordsOut = nWords_00 * nWords;
  pRVar1->nPatsOut = nWords_00 * nWords_00;
  pVVar2 = Vec_PtrAllocSimInfo(0x400,nWords_00);
  pRVar1->vPats = pVVar2;
  pVVar2 = Vec_PtrAllocSimInfo(0x80,nWords);
  pRVar1->vPats0 = pVVar2;
  pVVar2 = Vec_PtrAllocSimInfo(0x80,nWords);
  pRVar1->vPats1 = pVVar2;
  pVVar2 = Vec_PtrAllocSimInfo(0x80,nWords_00 * nWords);
  pRVar1->vOuts = pVVar2;
  pVVar3 = (Vec_Vec_t *)malloc(0x10);
  pVVar3->nCap = 0x10;
  ppvVar4 = (void **)malloc(0x80);
  pVVar3->pArray = ppvVar4;
  for (lVar6 = 0; lVar6 != 0x10; lVar6 = lVar6 + 1) {
    pvVar5 = calloc(1,0x10);
    ppvVar4[lVar6] = pvVar5;
  }
  pVVar3->nSize = 0x10;
  pRVar1->vCands = pVVar3;
  return pRVar1;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Allocate simulation engine.]

  Description []
               
  SideEffects []

  SeeAlso     []
 
***********************************************************************/
Res_Sim_t * Res_SimAlloc( int nWords )
{
    Res_Sim_t * p;
    p = ABC_ALLOC( Res_Sim_t, 1 );
    memset( p, 0, sizeof(Res_Sim_t) );
    // simulation parameters
    p->nWords    = nWords;
    p->nPats     = p->nWords * 8 * sizeof(unsigned);
    p->nWordsIn  = p->nPats;
    p->nBytesIn  = p->nPats * sizeof(unsigned);
    p->nPatsIn   = p->nPats * 8 * sizeof(unsigned);
    p->nWordsOut = p->nPats * p->nWords;
    p->nPatsOut  = p->nPats * p->nPats;
    // simulation info
    p->vPats     = Vec_PtrAllocSimInfo( 1024, p->nWordsIn );
    p->vPats0    = Vec_PtrAllocSimInfo( 128, p->nWords );
    p->vPats1    = Vec_PtrAllocSimInfo( 128, p->nWords );
    p->vOuts     = Vec_PtrAllocSimInfo( 128, p->nWordsOut );
    // resub candidates
    p->vCands    = Vec_VecStart( 16 );
    return p;
}